

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void timer_read(void *context,cio_epoll_error error)

{
  code *pcVar1;
  undefined8 uVar2;
  cio_timer_handler_t p_Var3;
  ssize_t sVar4;
  int *piVar5;
  cio_timer_handler_t handler_1;
  ssize_t ret;
  uint64_t number_of_expirations;
  code *pcStack_28;
  cio_error err;
  cio_timer_handler_t handler;
  cio_timer *timer;
  void *pvStack_10;
  cio_epoll_error error_local;
  void *context_local;
  
  handler = (cio_timer_handler_t)context;
  timer._4_4_ = error;
  pvStack_10 = context;
  if (error == CIO_EPOLL_SUCCESS) {
    ret = 0;
    sVar4 = read(*(int *)((long)context + 0x30),&ret,8);
    if (sVar4 == -1) {
      piVar5 = __errno_location();
      p_Var3 = handler;
      if (*piVar5 != 0xb) {
        pcVar1 = *(code **)(handler + 8);
        uVar2 = *(undefined8 *)(handler + 0x10);
        piVar5 = __errno_location();
        (*pcVar1)(p_Var3,uVar2,-*piVar5);
      }
    }
    else {
      pcVar1 = *(code **)(handler + 8);
      *(undefined8 *)(handler + 8) = 0;
      (*pcVar1)(handler,*(undefined8 *)(handler + 0x10),0);
    }
  }
  else {
    pcStack_28 = *(code **)((long)context + 8);
    *(undefined8 *)((long)context + 8) = 0;
    number_of_expirations._4_4_ = cio_linux_get_socket_error(*(int *)((long)context + 0x30));
    (*pcStack_28)(handler,*(undefined8 *)(handler + 0x10),number_of_expirations._4_4_);
  }
  return;
}

Assistant:

static void timer_read(void *context, enum cio_epoll_error error)
{
	struct cio_timer *timer = context;

	if (cio_unlikely(error != CIO_EPOLL_SUCCESS)) {
		cio_timer_handler_t handler = timer->handler;
		timer->handler = NULL;
		enum cio_error err = cio_linux_get_socket_error(timer->impl.ev.fd);
		handler(timer, timer->handler_context, err);
		return;
	}

	uint64_t number_of_expirations = 0;

	ssize_t ret = read(timer->impl.ev.fd, &number_of_expirations, sizeof(number_of_expirations));
	if (cio_unlikely(ret == -1)) {
		if (cio_unlikely(errno != EAGAIN)) {
			timer->handler(timer, timer->handler_context, (enum cio_error)(-errno));
		}
	} else {
		cio_timer_handler_t handler = timer->handler;
		timer->handler = NULL;
		handler(timer, timer->handler_context, CIO_SUCCESS);
	}
}